

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_3,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_3,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  Vector<float,_3> *pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  float *pfVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  long lVar8;
  DefaultSampling<float> *this_00;
  int rowNdx;
  float fVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  long lVar11;
  
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar3 = _DAT_00ac4b80;
  auVar2 = _DAT_00ac4b30;
  lVar4 = 0;
  lVar6 = 0;
  pfVar5 = (float *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    auVar10 = auVar2;
    do {
      bVar12 = SUB164(auVar10 ^ auVar3,4) == -0x80000000 && SUB164(auVar10 ^ auVar3,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar5 + lVar8) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar4 + -0xc != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar5 + lVar8 + 0xc) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0xc;
    pfVar5 = pfVar5 + 1;
  } while (lVar6 != 3);
  lVar4 = 0;
  this_00 = (DefaultSampling<float> *)&DAT_00000030;
  uVar7 = 3;
  pfVar5 = (float *)__return_storage_ptr__;
  do {
    lVar6 = -0x24;
    do {
      fVar9 = DefaultSampling<float>::genRandom(this_00,fmt,(Precision)uVar7,rnd);
      *(float *)((long)pfVar5 + lVar6 + 0x24) = fVar9;
      lVar6 = lVar6 + 0xc;
      uVar7 = extraout_RDX;
    } while (lVar6 != 0);
    lVar4 = lVar4 + 1;
    pfVar5 = pfVar5 + 1;
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}